

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem.c
# Opt level: O3

void memJoin(void *dest,void *src1,size_t count1,void *src2,size_t count2)

{
  size_t sVar1;
  undefined1 *__dest;
  undefined1 *__dest_00;
  undefined1 *__src;
  undefined1 uVar2;
  long lVar3;
  long lVar4;
  undefined1 *__dest_01;
  size_t sVar5;
  undefined1 *puVar6;
  size_t sVar7;
  ulong uVar8;
  bool bVar9;
  bool bVar10;
  
  bVar9 = count1 == 0;
  bVar10 = count2 == 0;
  __dest_01 = (undefined1 *)((long)dest + count1);
  if ((!bVar10 && !bVar9) && (dest < (void *)((long)src2 + count2) && src2 < __dest_01)) {
    __dest = (undefined1 *)((long)dest + count2);
    lVar4 = (long)src2 + -1;
    sVar5 = 1 - count1;
    puVar6 = __dest_01;
    sVar7 = 0;
    do {
      __dest_00 = (undefined1 *)((long)dest + sVar7);
      __src = (undefined1 *)((long)src1 + sVar7);
      if ((puVar6 + count2 <= __src) || (__src <= __dest_00)) {
        memmove(__dest_01,src2,count2 - sVar7);
        count2 = count1 - sVar7;
        src2 = __src;
        __dest_01 = __dest_00;
        goto LAB_0010f50f;
      }
      if ((__dest <= __src) || ((undefined1 *)((long)src1 + count1) <= __dest_00)) {
        memmove(__dest_00,src2,count2 - sVar7);
        memmove(__dest,__src,count1 - sVar7);
        uVar8 = 0;
        do {
          uVar2 = *__dest_00;
          if (count2 != sVar5) {
            memmove(__dest_00,(void *)((long)dest + sVar7 + 1),count2 - sVar5);
          }
          puVar6[count2 - 1] = uVar2;
          uVar8 = uVar8 + 1;
        } while (uVar8 < count2 - sVar7);
        return;
      }
      if ((puVar6 + count2 <= src2) || (src2 <= __dest_00)) {
        memmove(__dest,__src,count1 - sVar7);
        memmove(__dest_00,src2,count2 - sVar7);
        if (count2 == sVar7) {
          return;
        }
        uVar8 = 0;
        do {
          uVar2 = *__dest_00;
          if (count2 != sVar5) {
            memmove(__dest_00,(void *)((long)dest + sVar7 + 1),count2 - sVar5);
          }
          puVar6[count2 - 1] = uVar2;
          uVar8 = uVar8 + 1;
        } while (uVar8 < count2 - sVar7);
        return;
      }
      *(undefined1 *)((long)dest + sVar7) = *__src;
      puVar6[count2 - 1] = *(undefined1 *)(lVar4 + count2);
      bVar10 = count2 - 1 == sVar7;
      sVar1 = sVar7 + 1;
      bVar9 = count1 - 1 == sVar7;
      if ((bVar9) || (count2 - 1 == sVar7)) break;
      uVar8 = lVar4 + count2;
      lVar3 = sVar7 + 1;
      sVar5 = sVar5 + 2;
      puVar6 = puVar6 + -1;
      lVar4 = lVar4 + -1;
      sVar7 = sVar1;
    } while ((ulong)((long)dest + lVar3) < uVar8);
    count2 = count2 - sVar1;
    dest = (void *)((long)dest + sVar1);
    count1 = count1 - sVar1;
    src1 = (void *)((long)src1 + sVar1);
  }
  if (!bVar9) {
    memmove(dest,src1,count1);
  }
  if (bVar10) {
    return;
  }
LAB_0010f50f:
  memmove(__dest_01,src2,count2);
  return;
}

Assistant:

void memJoin(void* dest, const void* src1, size_t count1, const void* src2,
	size_t count2)
{
	register octet o;
	size_t i;
	ASSERT(memIsValid(src1, count1));
	ASSERT(memIsValid(src2, count2));
	ASSERT(memIsValid(dest, count1 + count2));
repeat:
	if (memIsDisjoint2(dest, count1, src2, count2))
	{
		memMove(dest, src1, count1);
		memMove((octet*)dest + count1, src2, count2);
	}
	else if (memIsDisjoint2((octet*)dest + count1, count2, src1, count1))
	{
		memMove((octet*)dest + count1, src2, count2);
		memMove(dest, src1, count1);
	}
	else if (memIsDisjoint2(dest, count2, src1, count1))
	{
		// dest <- src2 || src1
		memMove(dest, src2, count2);
		memMove((octet*)dest + count2, src1, count1);
		// dest <- dest <<< count2
		for (i = 0; i < count2; ++i)
		{
			o = ((octet*)dest)[0];
			memMove(dest, (octet*)dest + 1, count1 + count2 - 1);
			((octet*)dest)[count1 + count2 - 1] = o;
		}
	}
	else if (memIsDisjoint2((octet*)dest + count2, count1, src2, count2))
	{
		// dest <- src2 || src1
		memMove((octet*)dest + count2, src1, count1);
		memMove(dest, src2, count2);
		// dest <- dest <<< count2
		for (i = 0; i < count2; ++i)
		{
			o = ((octet*)dest)[0];
			memMove(dest, (octet*)dest + 1, count1 + count2 - 1);
			((octet*)dest)[count1 + count2 - 1] = o;
		}
	}
	else
	{
		// src1 (src2) пересекается и с префиксом, и с суффиксом dest
		// длины count2 (count1) => и первый, и последний октет dest
		// не входят не входят ни в src1, ни в src2
		((octet*)dest)[0] = ((const octet*)src1)[0];
		((octet*)dest)[count1 + count2 - 1] = ((const octet*)src2)[count2 - 1];
		VERIFY(count1--);
		VERIFY(count2--);
		src1 = (const octet*)src1 + 1;
		dest = (octet*)dest + 1;
		goto repeat;
	}
}